

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O0

LY_ERR lyd_diff_add_create_nested_userord(lyd_node *node)

{
  int iVar1;
  ly_ctx *local_50;
  char *local_48;
  char *dyn;
  size_t sStack_38;
  uint32_t pos;
  size_t bufused;
  size_t buflen;
  char *meta_val;
  char *meta_name;
  lyd_node *plStack_10;
  LY_ERR rc;
  lyd_node *node_local;
  
  meta_name._4_4_ = 0;
  bufused = 0;
  sStack_38 = 0;
  local_48 = (char *)0x0;
  plStack_10 = node;
  if (((node->schema == (lysc_node *)0x0) || ((node->schema->nodetype & 0x18) == 0)) ||
     ((node->schema->flags & 0x40) == 0)) {
    __assert_fail("lysc_is_userordered(node->schema)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                  0x7c,"LY_ERR lyd_diff_add_create_nested_userord(struct lyd_node *)");
  }
  if ((node->schema == (lysc_node *)0x0) ||
     (((node->schema->nodetype != 0x10 || ((node->schema->flags & 0x200) == 0)) &&
      ((node->schema->nodetype != 8 || ((node->schema->flags & 1) != 0)))))) {
    if (node->schema->nodetype == 0x10) {
      meta_val = "yang:key";
      if ((node->prev->next == (lyd_node *)0x0) || (node->prev->schema != node->schema)) {
        buflen = (long)"\t" + 1;
      }
      else {
        meta_name._4_4_ =
             lyd_path_list_predicate(node->prev,&local_48,&bufused,&stack0xffffffffffffffc8,'\0');
        if (meta_name._4_4_ != LY_SUCCESS) goto LAB_0011c4a9;
        buflen = (size_t)local_48;
      }
      meta_name._4_4_ = 0;
    }
    else {
      meta_val = "yang:value";
      if ((node->prev->next == (lyd_node *)0x0) || (node->prev->schema != node->schema)) {
        buflen = (long)"\t" + 1;
      }
      else {
        buflen = (size_t)lyd_get_value(node->prev);
      }
    }
  }
  else {
    meta_val = "yang:position";
    dyn._4_4_ = lyd_list_pos(node);
    if (dyn._4_4_ < 2) {
      buflen = (long)"\t" + 1;
    }
    else {
      iVar1 = asprintf(&local_48,"%u",(ulong)(dyn._4_4_ - 1));
      if (iVar1 == -1) {
        if (plStack_10->schema == (lysc_node *)0x0) {
          local_50 = (ly_ctx *)plStack_10[2].schema;
        }
        else {
          local_50 = plStack_10->schema->module->ctx;
        }
        ly_log(local_50,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lyd_diff_add_create_nested_userord");
        meta_name._4_4_ = LY_EMEM;
        goto LAB_0011c4a9;
      }
      buflen = (size_t)local_48;
    }
  }
  meta_name._4_4_ =
       lyd_new_meta((ly_ctx *)0x0,plStack_10,(lys_module *)0x0,meta_val,(char *)buflen,2,
                    (lyd_meta **)0x0);
LAB_0011c4a9:
  free(local_48);
  return meta_name._4_4_;
}

Assistant:

static LY_ERR
lyd_diff_add_create_nested_userord(struct lyd_node *node)
{
    LY_ERR rc = LY_SUCCESS;
    const char *meta_name, *meta_val;
    size_t buflen = 0, bufused = 0;
    uint32_t pos;
    char *dyn = NULL;

    assert(lysc_is_userordered(node->schema));

    /* get correct metadata name and value */
    if (lysc_is_dup_inst_list(node->schema)) {
        meta_name = "yang:position";

        pos = lyd_list_pos(node);
        if (pos > 1) {
            if (asprintf(&dyn, "%" PRIu32, pos - 1) == -1) {
                LOGMEM(LYD_CTX(node));
                rc = LY_EMEM;
                goto cleanup;
            }
            meta_val = dyn;
        } else {
            meta_val = "";
        }
    } else if (node->schema->nodetype == LYS_LIST) {
        meta_name = "yang:key";

        if (node->prev->next && (node->prev->schema == node->schema)) {
            LY_CHECK_GOTO(rc = lyd_path_list_predicate(node->prev, &dyn, &buflen, &bufused, 0), cleanup);
            meta_val = dyn;
        } else {
            meta_val = "";
        }
    } else {
        meta_name = "yang:value";

        if (node->prev->next && (node->prev->schema == node->schema)) {
            meta_val = lyd_get_value(node->prev);
        } else {
            meta_val = "";
        }
    }

    /* create the metadata */
    LY_CHECK_GOTO(rc = lyd_new_meta(NULL, node, NULL, meta_name, meta_val, LYD_NEW_VAL_STORE_ONLY, NULL), cleanup);

cleanup:
    free(dyn);
    return rc;
}